

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::TermLiteralClause>::FastGeneralizationsIterator::
FastGeneralizationsIterator<Kernel::TypedTermList>
          (FastGeneralizationsIterator *this,SubstitutionTree<Indexing::TermLiteralClause> *parent,
          Node *root,TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  TypedTermList query_00;
  TypedTermList query_01;
  TermList in_RCX;
  long in_RDI;
  Stack<void_*> *this_00;
  size_t initialCapacity;
  SortId in_R8;
  Renaming *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  FastGeneralizationsIterator *in_stack_ffffffffffffffb0;
  TermList TVar1;
  SortId SVar2;
  
  query_00._sort._content = in_R8._content;
  query_00.super_TermList._content = in_RCX._content;
  TVar1._content = in_RCX._content;
  SVar2._content = in_R8._content;
  SubstitutionTree<Indexing::TermLiteralClause>::GenMatcher::GenMatcher<Kernel::TypedTermList>
            ((GenMatcher *)in_stack_ffffffffffffffb0,query_00,in_stack_ffffffffffffffac);
  Lib::VirtualIterator<Indexing::TermLiteralClause_*>::VirtualIterator
            ((VirtualIterator<Indexing::TermLiteralClause_*> *)(in_RDI + 0x68));
  Kernel::Renaming::Renaming(in_stack_ffffffffffffff60);
  this_00 = (Stack<void_*> *)(in_RDI + 0xa8);
  Lib::Stack<void_*>::Stack(this_00,in_stack_ffffffffffffff68);
  initialCapacity = in_RDI + 200;
  Lib::Stack<unsigned_int>::Stack((Stack<unsigned_int> *)this_00,initialCapacity);
  Lib::Stack<Indexing::SubstitutionTree<Indexing::TermLiteralClause>::NodeAlgorithm>::Stack
            ((Stack<Indexing::SubstitutionTree<Indexing::TermLiteralClause>::NodeAlgorithm> *)
             this_00,initialCapacity);
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 0x108));
  query_01._sort._content = SVar2._content;
  query_01.super_TermList._content = TVar1._content;
  init<Kernel::TypedTermList>
            (in_stack_ffffffffffffffb0,
             (SubstitutionTree<Indexing::TermLiteralClause> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(Node *)in_R8._content,
             query_01,SUB81(in_RCX._content >> 0x38,0),SUB81(in_RCX._content >> 0x30,0));
  return;
}

Assistant:

FastGeneralizationsIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      : _subst(query, parent->_nextVar)
      { init(parent, root, query, retrieveSubstitution, reversed); }